

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

aiMesh * Assimp::StandardShapes::MakeMesh
                   (uint num,
                   _func_void_uint_vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_ptr
                   *GenerateFunc)

{
  aiMesh *paVar1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_28;
  
  local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*GenerateFunc)(num,&local_28);
  paVar1 = MakeMesh(&local_28,3);
  if (local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return paVar1;
}

Assistant:

aiMesh* StandardShapes::MakeMesh (unsigned int num,  void (*GenerateFunc)(
    unsigned int,std::vector<aiVector3D>&))
{
    std::vector<aiVector3D> temp;
    (*GenerateFunc)(num,temp);
    return MakeMesh(temp,3);
}